

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicodelib.h
# Opt level: O2

NormalizationProperties *
unicode::_normalization_properties::get_value
          (NormalizationProperties *__return_storage_ptr__,char32_t cp)

{
  char *pcVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)
           ((ulong)(uint)(cp & 0x7f) * 0x18 + *(long *)(_blocks + (ulong)((uint)cp >> 7) * 8));
  if (*(long *)(_blocks + (ulong)((uint)cp >> 7) * 8) == 0) {
    puVar2 = (undefined8 *)(_block_values + (ulong)((uint)cp >> 7) * 0x18);
  }
  __return_storage_ptr__->codes = (char32_t *)puVar2[2];
  pcVar1 = (char *)puVar2[1];
  *(undefined8 *)__return_storage_ptr__ = *puVar2;
  __return_storage_ptr__->compat_format = pcVar1;
  return __return_storage_ptr__;
}

Assistant:

inline NormalizationProperties get_value(char32_t cp) {
  auto i = cp / _block_size;
  auto bl = _blocks[i];
  if (bl) {
    auto off = cp % _block_size;
    return bl[off];
  }
  return _block_values[i];
}